

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

void __thiscall perfetto::base::PeriodicTask::PostNextTask(PeriodicTask *this)

{
  uint32_t uVar1;
  uint uVar2;
  element_type *ppPVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  int iVar4;
  long lVar5;
  undefined8 extraout_RAX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  uint32_t uVar6;
  TaskRunner *pTVar7;
  undefined8 *local_68;
  undefined8 uStack_60;
  code *local_58;
  code *pcStack_50;
  timespec local_48;
  
  uVar1 = (this->args_).period_ms;
  local_48.tv_sec = 0;
  local_48.tv_nsec = 0;
  iVar4 = clock_gettime(1,&local_48);
  if (iVar4 != 0) {
    PostNextTask();
    __clang_call_terminate(extraout_RAX);
  }
  lVar5 = local_48.tv_sec * 1000000000 + local_48.tv_nsec;
  uVar2 = (this->args_).period_ms;
  ppPVar3 = (this->weak_ptr_factory_).weak_ptr_.handle_.
            super___shared_ptr<perfetto::base::PeriodicTask_*,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_00 = (this->weak_ptr_factory_).weak_ptr_.handle_.
            super___shared_ptr<perfetto::base::PeriodicTask_*,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    pTVar7 = this->task_runner_;
    uVar6 = this->generation_;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
      pTVar7 = this->task_runner_;
      uVar6 = this->generation_;
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
        goto LAB_002679f4;
      }
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
      pTVar7 = this->task_runner_;
      uVar6 = this->generation_;
    }
    this_00->_M_use_count = this_00->_M_use_count + 1;
  }
LAB_002679f4:
  local_58 = (code *)0x0;
  pcStack_50 = (code *)0x0;
  local_68 = (undefined8 *)0x0;
  uStack_60 = 0;
  local_68 = (undefined8 *)operator_new(0x20);
  *local_68 = RunTaskAndPostNext;
  *(uint32_t *)(local_68 + 1) = uVar6;
  local_68[2] = ppPVar3;
  local_68[3] = this_00;
  pcStack_50 = std::
               _Function_handler<void_(),_std::_Bind<void_(*(perfetto::base::WeakPtr<perfetto::base::PeriodicTask>,_unsigned_int))(perfetto::base::WeakPtr<perfetto::base::PeriodicTask>,_unsigned_int)>_>
               ::_M_invoke;
  local_58 = std::
             _Function_handler<void_(),_std::_Bind<void_(*(perfetto::base::WeakPtr<perfetto::base::PeriodicTask>,_unsigned_int))(perfetto::base::WeakPtr<perfetto::base::PeriodicTask>,_unsigned_int)>_>
             ::_M_manager;
  (*pTVar7->_vptr_TaskRunner[3])
            (pTVar7,&local_68,(ulong)(uVar1 - (int)((lVar5 / 1000000) % (long)(ulong)uVar2)));
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,3);
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

void PeriodicTask::PostNextTask() {
  PERFETTO_DCHECK_THREAD(thread_checker_);
  PERFETTO_DCHECK(args_.period_ms > 0);
  PERFETTO_DCHECK(!timer_fd_);
  uint32_t delay_ms =
      args_.period_ms -
      static_cast<uint32_t>(base::GetWallTimeMs().count() % args_.period_ms);
  auto weak_this = weak_ptr_factory_.GetWeakPtr();
  task_runner_->PostDelayedTask(
      std::bind(PeriodicTask::RunTaskAndPostNext, weak_this, generation_),
      delay_ms);
}